

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O1

void __thiscall Assimp::NFFImporter::MeshInfo::MeshInfo(MeshInfo *this,PatchType _pType,bool bL)

{
  ShadingInfo::ShadingInfo(&this->shader);
  this->pType = _pType;
  this->bLocked = bL;
  (this->center).x = 0.0;
  (this->center).y = 0.0;
  *(undefined8 *)&(this->center).z = 0x3f80000000000000;
  (this->radius).y = 1.0;
  (this->radius).z = 1.0;
  (this->dir).x = 0.0;
  (this->dir).y = 1.0;
  (this->dir).z = 0.0;
  this->name[0] = '\0';
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->uvs).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

MeshInfo(PatchType _pType, bool bL = false)
            : pType     (_pType)
            , bLocked   (bL)
            , radius    (1.f,1.f,1.f)
            , dir       (0.f,1.f,0.f)
            , matIndex  (0)
        {
            name[0] = '\0'; // by default meshes are unnamed
        }